

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall metaf::TrendGroup::isTimeSpanGroup(TrendGroup *this)

{
  byte bVar1;
  
  if (this->t == TIME_SPAN) {
    bVar1 = 0;
    if ((this->isTafTimeSpanGroup != true) || (bVar1 = 0, this->prob != NONE)) goto LAB_00188eb8;
    if ((((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) &&
       (((this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0)) {
      bVar1 = (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>._M_engaged ^ 1;
      goto LAB_00188eb8;
    }
  }
  bVar1 = 0;
LAB_00188eb8:
  return (bool)(bVar1 & 1);
}

Assistant:

bool TrendGroup::isTimeSpanGroup() const {
	// Time span group has format DDHH/DDHH,
	// only time 'from' and 'till' must be reported
	// isTafTimeSpanGroup guarantees that DDHH/DDHH group is 
	// not confused with appended groups FMxxxx TLxxxx and HHMM/HHMM
	if (type() != Type::TIME_SPAN ||
		!isTafTimeSpanGroup ||
		probability() != Probability::NONE ||
		!timeFrom().has_value() || 
		!timeUntil().has_value()) return false;
	if (timeAt().has_value()) return false;
	return true;
}